

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType2::Encode(GridDataType2 *this,KDataStream *stream)

{
  bool bVar1;
  reference pfVar2;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  GridDataType2 *this_local;
  
  GridData::Encode(&this->super_GridData,stream);
  KDataStream::operator<<(stream,*(unsigned_short *)&(this->super_GridData).field_0xc);
  citrEnd = std::vector<float,_std::allocator<float>_>::begin(&this->m_vf32Values);
  local_28._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::end(&this->m_vf32Values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pfVar2 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&citrEnd);
    KDataStream::operator<<(stream,*pfVar2);
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&citrEnd);
  }
  KDataStream::operator<<(stream,this->m_ui16Padding);
  return;
}

Assistant:

void GridDataType2::Encode( KDataStream & stream ) const
{
    GridData::Encode( stream );

    stream << m_ui16NumValues;

    vector<KFLOAT32>::const_iterator citr = m_vf32Values.begin();
    vector<KFLOAT32>::const_iterator citrEnd = m_vf32Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    stream << m_ui16Padding;
}